

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

FileName * __thiscall
embree::CoronaLoader::load<embree::FileName>(CoronaLoader *this,Ref<embree::XML> *xml)

{
  size_type sVar1;
  runtime_error *this_00;
  long *in_RDX;
  FileName *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a0 [35];
  undefined1 local_7d;
  string *in_stack_ffffffffffffff88;
  FileName *in_stack_ffffffffffffff90;
  Token *in_stack_ffffffffffffffa8;
  string local_50 [32];
  long *local_30;
  ParseLocation *in_stack_ffffffffffffffe8;
  
  local_30 = in_RDX;
  sVar1 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar1 != 1) {
    local_7d = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_30;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffe8);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_50);
    local_7d = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_30 + 0x98),0);
  Token::Identifier_abi_cxx11_(in_stack_ffffffffffffffa8);
  embree::FileName::FileName(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_a0);
  return in_RDI;
}

Assistant:

FileName CoronaLoader::load<FileName>(const Ref<XML>& xml) 
  {
    if (xml->body.size() != 1) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong FileName body");
    return xml->body[0].Identifier();
  }